

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

AST * __thiscall jsonnet::internal::anon_unknown_0::Parser::parse(Parser *this,uint max_precedence)

{
  Token *pTVar1;
  Token *in_RDI;
  AST *lhs;
  Token *begin;
  unique_ptr<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_> begin_;
  AST *ast;
  uint in_stack_00000e54;
  Token *in_stack_00000e58;
  AST *in_stack_00000e60;
  Parser *in_stack_00000e68;
  Parser *in_stack_000015f8;
  Parser *in_stack_000018a8;
  pointer in_stack_ffffffffffffff78;
  unique_ptr<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
  *in_stack_ffffffffffffff80;
  undefined8 local_8;
  
  local_8 = maybeParseGreedy(in_stack_000018a8);
  if (local_8 == (AST *)0x0) {
    operator_new(0xc0);
    pTVar1 = peek((Parser *)0x1e3757);
    Token::Token(in_RDI,pTVar1);
    std::unique_ptr<jsonnet::internal::Token,std::default_delete<jsonnet::internal::Token>>::
    unique_ptr<std::default_delete<jsonnet::internal::Token>,void>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::unique_ptr<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>::
    operator*(in_stack_ffffffffffffff80);
    parseTerminalBracketsOrUnary(in_stack_000015f8);
    local_8 = parseInfix(in_stack_00000e68,in_stack_00000e60,in_stack_00000e58,in_stack_00000e54);
    std::unique_ptr<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>::
    ~unique_ptr((unique_ptr<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                 *)local_8);
  }
  return local_8;
}

Assistant:

AST *parse(unsigned max_precedence)
    {
        AST *ast = maybeParseGreedy();
        // There cannot be an operator after a greedy parse.
        if (ast != nullptr) return ast;

        // If we get here, we could be parsing an infix construct.

        // Allocate this on the heap to control stack growth.
        std::unique_ptr<Token> begin_(new Token(peek()));
        const Token &begin = *begin_;

        AST *lhs = parseTerminalBracketsOrUnary();

        return parseInfix(lhs, begin, max_precedence);
    }